

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::AddIncludeDirectory(cmGeneratorTarget *this,string *src,bool before)

{
  Entry **__return_storage_ptr__;
  cmTarget *this_00;
  auto_ptr_ref<cmCompiledGeneratorExpression> r;
  cmCompiledGeneratorExpression *this_01;
  TargetPropertyEntry *this_02;
  auto_ptr<cmCompiledGeneratorExpression> local_c8;
  TargetPropertyEntry *local_c0;
  const_iterator local_b8;
  __normal_iterator<cmGeneratorTarget::TargetPropertyEntry_**,_std::vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>_>
  local_b0;
  iterator pos;
  auto_ptr<cmCompiledGeneratorExpression> local_98;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpression ge;
  cmListFileBacktrace lfbt;
  cmListFileBacktrace local_40;
  byte local_19;
  string *psStack_18;
  bool before_local;
  string *src_local;
  cmGeneratorTarget *this_local;
  
  this_00 = this->Target;
  local_19 = before;
  psStack_18 = src;
  src_local = (string *)this;
  cmMakefile::GetBacktrace(&local_40,this->Makefile);
  cmTarget::InsertInclude(this_00,src,&local_40,(bool)(local_19 & 1));
  cmListFileBacktrace::~cmListFileBacktrace(&local_40);
  __return_storage_ptr__ = &ge.Backtrace.Cur;
  cmMakefile::GetBacktrace((cmListFileBacktrace *)__return_storage_ptr__,this->Makefile);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)&cge,(cmListFileBacktrace *)__return_storage_ptr__);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&pos,(string *)&cge);
  r = ::cm::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&pos);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr(&local_98,r);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&pos);
  this_01 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::operator->(&local_98);
  cmCompiledGeneratorExpression::SetEvaluateForBuildsystem(this_01,true);
  if ((local_19 & 1) == 0) {
    local_b0._M_current =
         (TargetPropertyEntry **)
         std::
         vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
         ::end(&this->IncludeDirectoriesEntries);
  }
  else {
    local_b0._M_current =
         (TargetPropertyEntry **)
         std::
         vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
         ::begin(&this->IncludeDirectoriesEntries);
  }
  __gnu_cxx::
  __normal_iterator<cmGeneratorTarget::TargetPropertyEntry*const*,std::vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>>
  ::__normal_iterator<cmGeneratorTarget::TargetPropertyEntry**>
            ((__normal_iterator<cmGeneratorTarget::TargetPropertyEntry*const*,std::vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>>
              *)&local_b8,&local_b0);
  this_02 = (TargetPropertyEntry *)operator_new(0x10);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr(&local_c8,&local_98);
  TargetPropertyEntry::TargetPropertyEntry(this_02,&local_c8,&TargetPropertyEntry::NoLinkImplItem);
  local_c0 = this_02;
  std::
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ::insert(&this->IncludeDirectoriesEntries,local_b8,&local_c0);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_c8);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_98);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&cge);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&ge.Backtrace.Cur);
  return;
}

Assistant:

void cmGeneratorTarget::AddIncludeDirectory(const std::string& src,
                                            bool before)
{
  this->Target->InsertInclude(src, this->Makefile->GetBacktrace(), before);
  cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
  cmGeneratorExpression ge(lfbt);
  CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(src);
  cge->SetEvaluateForBuildsystem(true);
  // Insert before begin/end
  std::vector<TargetPropertyEntry*>::iterator pos = before
    ? this->IncludeDirectoriesEntries.begin()
    : this->IncludeDirectoriesEntries.end();
  this->IncludeDirectoriesEntries.insert(pos, new TargetPropertyEntry(cge));
}